

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Indexer.cpp
# Opt level: O0

vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> * __thiscall
Indexer::created_dataset_ptrs(Indexer *this)

{
  bool bVar1;
  long in_RSI;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *in_RDI;
  unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_> *p;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
  *__range1;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *ptrs;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *this_00;
  __normal_iterator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_*,_std::vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>_>
  local_28;
  long local_20;
  undefined1 local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::vector
            ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)0x172abe);
  local_20 = in_RSI + 0xc0;
  local_28._M_current =
       (unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_> *)
       std::
       vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
       ::begin((vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
                *)in_RDI);
  std::
  vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
  ::end((vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
         *)in_RDI);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_*,_std::vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>_>
                             *)this_00,
                            (__normal_iterator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_*,_std::vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>_>
                             *)in_RDI), bVar1) {
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_*,_std::vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>_>
    ::operator*(&local_28);
    std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>::get
              ((unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_> *)this_00);
    std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::push_back
              (this_00,(value_type *)in_RDI);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_*,_std::vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>_>
    ::operator++(&local_28);
  }
  return this_00;
}

Assistant:

std::vector<const OnDiskDataset *> Indexer::created_dataset_ptrs() {
    std::vector<const OnDiskDataset *> ptrs;

    for (auto &p : created_datasets) {
        ptrs.push_back(p.get());
    }

    return ptrs;
}